

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.hxx
# Opt level: O3

void __thiscall
nuraft::FakeNetwork::ReqPkg::ReqPkg(ReqPkg *this,ptr<req_msg> *_req,rpc_handler *_when_done)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->req).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (_req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (this->req).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function(&this->whenDone,_when_done);
  return;
}

Assistant:

ReqPkg(ptr<req_msg>& _req, rpc_handler& _when_done)
            : req(_req), whenDone(_when_done)
            {}